

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectgenerator.cpp
# Opt level: O2

QString * __thiscall
ProjectGenerator::getWritableVar
          (QString *__return_storage_ptr__,ProjectGenerator *this,char *vk,bool param_2)

{
  long lVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  bool bVar5;
  QList<ProString> *this_00;
  iterator this_01;
  iterator iVar6;
  int i;
  char *pcVar7;
  char *pcVar8;
  QStringBuilder<ProString,_const_char_(&)[5]> *this_02;
  long in_FS_OFFSET;
  QStringBuilder<const_char_(&)[4],_QString_&> local_128;
  ProString local_118;
  QStringBuilder<ProString,_const_char_(&)[5]> local_e8;
  QArrayDataPointer<char16_t> local_a8;
  undefined1 local_88 [32];
  ProKey v;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  v.super_ProString.m_file = -0x55555556;
  v.super_ProString._36_4_ = 0xaaaaaaaa;
  v.super_ProString.m_hash = 0xaaaaaaaaaaaaaaaa;
  v.super_ProString.m_string.d.size = -0x5555555555555556;
  v.super_ProString.m_offset = -0x55555556;
  v.super_ProString.m_length = -0x55555556;
  v.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  v.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  ProKey::ProKey(&v,vk);
  this_00 = &QMakeEvaluator::valuesRef
                       (&((this->super_MakefileGenerator).project)->super_QMakeEvaluator,&v)->
             super_QList<ProString>;
  if ((this_00->d).size == 0) {
    QString::QString(__return_storage_ptr__,"");
    goto LAB_00173f87;
  }
  this_01 = QList<ProString>::begin(this_00);
  while( true ) {
    iVar6 = QList<ProString>::end(this_00);
    if (this_01.i == iVar6.i) break;
    bVar5 = ProString::contains(this_01.i,(QChar)0x20,CaseSensitive);
    if (bVar5) {
      bVar5 = ProString::startsWith(this_01.i,(QChar)0x20,CaseSensitive);
      if (!bVar5) {
        local_e8.a.m_string.d.d = (Data *)0x2236a5;
        local_e8.a.m_string.d.size = 0x2236a5;
        local_e8.a.m_string.d.ptr = (char16_t *)this_01.i;
        ProString::operator=
                  (this_01.i,
                   (QStringBuilder<QStringBuilder<const_char_(&)[2],_ProString_&>,_const_char_(&)[2]>
                    *)&local_e8);
      }
    }
    this_01.i = this_01.i + 1;
  }
  local_88._0_8_ = (Data *)0x0;
  local_88._8_8_ = (char16_t *)0x0;
  local_88._16_8_ = 0;
  bVar5 = ProString::endsWith(&v.super_ProString,"_REMOVE",CaseSensitive);
  if (bVar5) {
    ProString::left(&local_118,&v.super_ProString,v.super_ProString.m_length + -7);
    ProString::ProString(&local_e8.a,&local_118);
    local_e8.b = (char (*) [5])0x21c058;
    QStringBuilder<ProString,_const_char_(&)[5]>::convertTo<QString>((QString *)&local_a8,&local_e8)
    ;
LAB_00173dfd:
    pcVar8 = (char *)local_a8.size;
    local_88._8_8_ = local_a8.ptr;
    local_88._0_8_ = local_a8.d;
    this_02 = (QStringBuilder<ProString,_const_char_(&)[5]> *)&local_118;
    local_a8.d = (Data *)0x0;
    local_a8.ptr = (char16_t *)0x0;
    local_88._16_8_ = local_a8.size;
    local_a8.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
  }
  else {
    bVar5 = ProString::endsWith(&v.super_ProString,"_ASSIGN",CaseSensitive);
    if (bVar5) {
      ProString::left(&local_118,&v.super_ProString,v.super_ProString.m_length + -7);
      ProString::ProString(&local_e8.a,&local_118);
      local_e8.b = (char (*) [5])0x21c822;
      QStringBuilder<ProString,_const_char_(&)[4]>::convertTo<QString>
                ((QString *)&local_a8,(QStringBuilder<ProString,_const_char_(&)[4]> *)&local_e8);
      goto LAB_00173dfd;
    }
    local_118.m_string.d.ptr = L" += ";
    this_02 = &local_e8;
    local_118.m_string.d.d = (Data *)&v.super_ProString;
    QStringBuilder<const_ProKey_&,_const_char_(&)[5]>::convertTo<QString>
              ((QString *)this_02,(QStringBuilder<const_ProKey_&,_const_char_(&)[5]> *)&local_118);
    pcVar8 = (char *)local_e8.a.m_string.d.size;
    local_88._8_8_ = local_e8.a.m_string.d.ptr;
    local_88._0_8_ = local_e8.a.m_string.d.d;
    local_e8.a.m_string.d.d = (Data *)0x0;
    local_e8.a.m_string.d.ptr = (char16_t *)0x0;
    local_88._16_8_ = local_e8.a.m_string.d.size;
    local_e8.a.m_string.d.size = 0;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_02);
  local_e8.a.m_string.d.size = -0x5555555555555556;
  local_e8.a.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_e8.a.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  ProStringList::join((QString *)&local_e8,(ProStringList *)this_00,(QChar)0x20);
  if ((char *)0x50 < pcVar8 + local_e8.a.m_string.d.size) {
    local_118.m_string.d.size = 0;
    local_118.m_string.d.d = (Data *)0x0;
    local_118.m_string.d.ptr = (char16_t *)0x0;
    for (pcVar7 = (char *)0x0; pcVar7 < pcVar8; pcVar7 = pcVar7 + 1) {
      QString::operator+=(&local_118.m_string," ");
    }
    local_128.a = (char (*) [4])0x21c05d;
    local_128.b = &local_118.m_string;
    ProStringList::join<char_const(&)[4],QString&>
              ((QString *)&local_a8,(ProStringList *)this_00,&local_128);
    qVar4 = local_e8.a.m_string.d.size;
    pcVar3 = local_e8.a.m_string.d.ptr;
    pDVar2 = local_e8.a.m_string.d.d;
    local_e8.a.m_string.d.d = local_a8.d;
    local_e8.a.m_string.d.ptr = local_a8.ptr;
    local_a8.d = pDVar2;
    local_a8.ptr = pcVar3;
    local_e8.a.m_string.d.size = local_a8.size;
    local_a8.size = qVar4;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_118);
  }
  local_118.m_string.d.size = 0x21d038;
  local_118.m_string.d.d = (Data *)local_88;
  local_118.m_string.d.ptr = (char16_t *)&local_e8;
  QStringBuilder<QStringBuilder<QString_&,_QString_&>,_const_char_(&)[2]>::convertTo<QString>
            (__return_storage_ptr__,
             (QStringBuilder<QStringBuilder<QString_&,_QString_&>,_const_char_(&)[2]> *)&local_118);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
LAB_00173f87:
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&v);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString
ProjectGenerator::getWritableVar(const char *vk, bool)
{
    const ProKey v(vk);
    ProStringList &vals = project->values(v);
    if(vals.isEmpty())
        return "";

    // If values contain spaces, ensure that they are quoted
    for (ProStringList::iterator it = vals.begin(); it != vals.end(); ++it) {
        if ((*it).contains(' ') && !(*it).startsWith(' '))
            *it = "\"" + *it + "\"";
    }

    QString ret;
    if(v.endsWith("_REMOVE"))
        ret = v.left(v.length() - 7) + " -= ";
    else if(v.endsWith("_ASSIGN"))
        ret = v.left(v.length() - 7) + " = ";
    else
        ret = v + " += ";
    QString join = vals.join(' ');
    if(ret.size() + join.size() > 80) {
        QString spaces;
        for(int i = 0; i < ret.size(); i++)
            spaces += " ";
        join = vals.join(" \\\n" + spaces);
    }
    return ret + join + "\n";
}